

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::JobManager::AppendImport
          (Error *__return_storage_ptr__,JobManager *this,uint64_t aXpanId,Expression *aExpr)

{
  string *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ErrorCode EVar2;
  pointer pbVar3;
  pointer pbVar4;
  value_t vVar5;
  json_value jVar6;
  int iVar7;
  const_iterator cVar8;
  reference other;
  char *pcVar9;
  undefined8 *puVar10;
  char *pcVar11;
  _Alloc_hider _Var12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar13;
  bool bVar14;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  Json jsonSrc;
  string jsonStr;
  Json json;
  CommissionerDataset dataset;
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  undefined1 local_218 [24];
  parse_func local_200 [1];
  undefined1 local_1f8 [8];
  json_value local_1f0;
  string local_1e8;
  undefined1 local_1c8 [8];
  json_value local_1c0;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  undefined1 auStack_1a8 [24];
  _Alloc_hider local_190;
  undefined1 auStack_188 [8];
  undefined1 local_180 [24];
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  vStack_168;
  pointer local_150;
  pointer local_138;
  pointer local_120;
  pointer local_100;
  undefined1 local_d8 [8];
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  undefined1 local_88 [8];
  json_value local_80;
  undefined1 local_78 [8];
  json_value local_70;
  undefined1 local_68 [8];
  json_value local_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_90 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_90;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1f8[0] = null;
  local_1f0.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_1f8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_1f8);
  local_1c8[0] = null;
  local_1c0.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_1c8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_1c8);
  JsonFromFile((Error *)local_1b8,&local_1e8,&this->mImportFile);
  __return_storage_ptr__->mCode = local_1b8._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_1b0);
  EVar2 = __return_storage_ptr__->mCode;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(auStack_1a8 + 8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_p != p_Var1) {
    operator_delete(local_1b0._M_p);
  }
  if (EVar2 != kNone) goto LAB_0015656e;
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            ((input_adapter *)local_1b8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_1e8._M_dataplus._M_p,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_1e8._M_dataplus._M_p + local_1e8._M_string_length));
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_68,(input_adapter *)local_1b8,(parser_callback_t *)&local_58,true);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_68);
  jVar6 = local_1f0;
  vVar5 = local_1f8[0];
  local_1f8[0] = local_68[0];
  local_68[0] = vVar5;
  local_1f0 = local_60;
  local_60 = jVar6;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_1f8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_68);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_68 + 8),local_68[0]);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_p);
  }
  if (aXpanId == 0) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_78,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_1f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_78);
    jVar6 = local_1c0;
    vVar5 = local_1c8[0];
    local_1c8[0] = local_78[0];
    local_78[0] = vVar5;
    local_1c0 = local_70;
    local_70 = jVar6;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_1c8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_78);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_78 + 8),local_78[0]);
  }
  else {
    utils::Hex<unsigned_long>((string *)local_1b8,aXpanId);
    jVar6 = local_1f0;
    bVar14 = true;
    if (local_1f8[0] == object) {
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
              ::find(&(local_1f0.object)->_M_t,(key_type *)local_1b8);
      bVar14 = (_Rb_tree_header *)cVar8._M_node ==
               &((jVar6.object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    if (local_1b8 != (undefined1  [8])auStack_1a8) {
      operator_delete((void *)local_1b8);
    }
    if (!bVar14) {
      utils::Hex<unsigned_long>((string *)local_1b8,aXpanId);
      other = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_1f8,(key_type *)local_1b8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_88,other);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_88);
      jVar6 = local_1c0;
      vVar5 = local_1c8[0];
      local_1c8[0] = local_88[0];
      local_88[0] = vVar5;
      local_1c0 = local_80;
      local_80 = jVar6;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_1c8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_88);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_88 + 8),local_88[0]);
      if (local_1b8 != (undefined1  [8])auStack_1a8) {
        operator_delete((void *)local_1b8);
      }
    }
  }
  aVar13.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump((string_t *)local_1b8,
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)local_1c8,4,' ',false,strict);
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1b8);
  if (local_1b8 != (undefined1  [8])auStack_1a8) {
    operator_delete((void *)local_1b8);
  }
  utils::ToLower((string *)local_1b8,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  iVar7 = std::__cxx11::string::compare(local_1b8);
  if (local_1b8 != (undefined1  [8])auStack_1a8) {
    operator_delete((void *)local_1b8);
  }
  if (iVar7 != 0) {
    utils::ToLower((string *)local_1b8,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    iVar7 = std::__cxx11::string::compare(local_1b8);
    if (local_1b8 != (undefined1  [8])auStack_1a8) {
      operator_delete((void *)local_1b8);
    }
    if (iVar7 == 0) {
      local_1b0._M_p = (pointer)0x0;
      auStack_1a8._0_8_ = auStack_1a8._0_8_ & 0xffffffffffffff00;
      local_190._M_p = (pointer)0x0;
      auStack_188 = (undefined1  [8])((ulong)auStack_188 & 0xffffffffffffff00);
      local_180._8_8_ = &vStack_168;
      local_180._16_8_ = (pointer)0x0;
      vStack_168.
      super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)vStack_168.
                            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
      vStack_168.
      super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
      pbVar3 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_1b8 = (undefined1  [8])auStack_1a8;
      auStack_1a8._16_8_ = (format_string_checker<char> *)auStack_188;
      if ((long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 == 0x40) {
        utils::ToLower((string *)local_228,pbVar3 + 1);
        iVar7 = std::__cxx11::string::compare(local_228);
        if ((undefined1 *)CONCAT44(local_228._4_4_,local_228._0_4_) != local_218) {
          operator_delete((undefined1 *)CONCAT44(local_228._4_4_,local_228._0_4_));
        }
        if (iVar7 != 0) goto LAB_00156bd4;
        BbrDatasetFromJson((Error *)local_228,(BbrDataset *)local_1b8,&local_1e8);
        __return_storage_ptr__->mCode = local_228._0_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_220);
        if (local_220._M_p != local_218 + 8) {
          operator_delete(local_220._M_p);
        }
        if (__return_storage_ptr__->mCode != kNone) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::dump((string_t *)local_228,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_1f8,4,' ',false,strict);
          std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_228);
          if ((undefined1 *)CONCAT44(local_228._4_4_,local_228._0_4_) != local_218) {
            operator_delete((undefined1 *)CONCAT44(local_228._4_4_,local_228._0_4_));
          }
          BbrDatasetFromJson((Error *)local_228,(BbrDataset *)local_1b8,&local_1e8);
          __return_storage_ptr__->mCode = local_228._0_4_;
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_220);
          EVar2 = __return_storage_ptr__->mCode;
          if (local_220._M_p != local_218 + 8) {
            operator_delete(local_220._M_p);
          }
          if (EVar2 == kNone) goto LAB_00157149;
          goto LAB_00156ce3;
        }
LAB_00157149:
        bVar14 = true;
      }
      else {
LAB_00156bd4:
        local_228._0_4_ = none_type;
        local_220._M_p = "import usupported";
        local_218._0_8_ = 0x11;
        local_218._8_8_ = 0;
        local_200[0] = (parse_func)0x0;
        pcVar11 = "import usupported";
        local_218._16_8_ = (format_string_checker<char> *)local_228;
        do {
          pcVar9 = pcVar11 + 1;
          if (*pcVar11 == '}') {
            if ((pcVar9 == "") || (*pcVar9 != '}')) {
              fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar9 = pcVar11 + 2;
          }
          else if (*pcVar11 == '{') {
            pcVar9 = fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar11,"",(format_string_checker<char> *)local_228);
          }
          pcVar11 = pcVar9;
        } while (pcVar9 != "");
        args_00.field_1.args_ = aVar13.args_;
        args_00.desc_ = (unsigned_long_long)local_228;
        fmt::v10::vformat_abi_cxx11_
                  (&local_b0,(v10 *)"import usupported",(string_view)ZEXT816(0x11),args_00);
        local_d8._0_4_ = kInvalidArgs;
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_b0._M_dataplus._M_p,
                   local_b0._M_dataplus._M_p + local_b0._M_string_length);
        __return_storage_ptr__->mCode = local_d8._0_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_d0);
        if (local_d0 != local_c0) {
          operator_delete(local_d0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
LAB_00156ce3:
        bVar14 = false;
      }
      if ((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           *)local_180._8_8_ != &vStack_168) {
        operator_delete((void *)local_180._8_8_);
      }
      if ((format_string_checker<char> *)auStack_1a8._16_8_ !=
          (format_string_checker<char> *)auStack_188) {
        operator_delete((void *)auStack_1a8._16_8_);
      }
      if (local_1b8 != (undefined1  [8])auStack_1a8) {
        operator_delete((void *)local_1b8);
      }
    }
    else {
      utils::ToLower((string *)local_1b8,
                     (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
      iVar7 = std::__cxx11::string::compare(local_1b8);
      if (local_1b8 != (undefined1  [8])auStack_1a8) {
        operator_delete((void *)local_1b8);
      }
      if (iVar7 != 0) {
        __assert_fail("condition",
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                      ,0x26c,
                      "Error ot::commissioner::JobManager::AppendImport(uint64_t, Interpreter::Expression &)"
                     );
      }
      local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffff00000000);
      local_1b0._M_p = (pointer)0x0;
      auStack_1a8._0_8_ = 0;
      auStack_1a8._8_8_ = 0;
      auStack_1a8._16_8_ = (format_string_checker<char> *)0x0;
      local_190._M_p = (pointer)0x0;
      auStack_188 = (undefined1  [8])0x0;
      local_180._0_8_ = (pointer)0x0;
      local_180._8_8_ =
           (vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            *)0x0;
      local_180._16_8_ = (pointer)0x0;
      vStack_168.
      super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pbVar3 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 == 0x40) {
        utils::ToLower((string *)local_228,pbVar3 + 1);
        iVar7 = std::__cxx11::string::compare(local_228);
        if ((undefined1 *)CONCAT44(local_228._4_4_,local_228._0_4_) != local_218) {
          operator_delete((undefined1 *)CONCAT44(local_228._4_4_,local_228._0_4_));
        }
        if (iVar7 != 0) goto LAB_001569a0;
        CommissionerDatasetFromJson((Error *)local_228,(CommissionerDataset *)local_1b8,&local_1e8);
        __return_storage_ptr__->mCode = local_228._0_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_220);
        if (local_220._M_p != local_218 + 8) {
          operator_delete(local_220._M_p);
        }
        if (__return_storage_ptr__->mCode != kNone) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::dump((string_t *)local_228,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_1f8,4,' ',false,strict);
          std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_228);
          if ((undefined1 *)CONCAT44(local_228._4_4_,local_228._0_4_) != local_218) {
            operator_delete((undefined1 *)CONCAT44(local_228._4_4_,local_228._0_4_));
          }
          CommissionerDatasetFromJson
                    ((Error *)local_228,(CommissionerDataset *)local_1b8,&local_1e8);
          __return_storage_ptr__->mCode = local_228._0_4_;
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_220);
          EVar2 = __return_storage_ptr__->mCode;
          if (local_220._M_p != local_218 + 8) {
            operator_delete(local_220._M_p);
          }
          if (EVar2 == kNone) goto LAB_0015706c;
          goto LAB_00156aaf;
        }
LAB_0015706c:
        bVar14 = true;
      }
      else {
LAB_001569a0:
        local_228._0_4_ = none_type;
        local_220._M_p = "import usupported";
        local_218._0_8_ = 0x11;
        local_218._8_8_ = 0;
        local_200[0] = (parse_func)0x0;
        pcVar11 = "import usupported";
        local_218._16_8_ = (format_string_checker<char> *)local_228;
        do {
          pcVar9 = pcVar11 + 1;
          if (*pcVar11 == '}') {
            if ((pcVar9 == "") || (*pcVar9 != '}')) {
              fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar9 = pcVar11 + 2;
          }
          else if (*pcVar11 == '{') {
            pcVar9 = fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar11,"",(format_string_checker<char> *)local_228);
          }
          pcVar11 = pcVar9;
        } while (pcVar9 != "");
        args.field_1.args_ = aVar13.args_;
        args.desc_ = (unsigned_long_long)local_228;
        fmt::v10::vformat_abi_cxx11_
                  (&local_b0,(v10 *)"import usupported",(string_view)ZEXT816(0x11),args);
        local_d8._0_4_ = kInvalidArgs;
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_b0._M_dataplus._M_p,
                   local_b0._M_dataplus._M_p + local_b0._M_string_length);
        __return_storage_ptr__->mCode = local_d8._0_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_d0);
        if (local_d0 != local_c0) {
          operator_delete(local_d0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
LAB_00156aaf:
        bVar14 = false;
      }
      if ((pointer)local_180._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_180._0_8_);
      }
      _Var12._M_p = (pointer)auStack_1a8._16_8_;
      if ((format_string_checker<char> *)auStack_1a8._16_8_ != (format_string_checker<char> *)0x0) {
LAB_00156ad0:
        operator_delete(_Var12._M_p);
      }
LAB_00156ad5:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        operator_delete(local_1b0._M_p);
      }
    }
    if (!bVar14) goto LAB_0015656e;
LAB_00156d2c:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(aExpr,&local_1e8);
    goto LAB_0015656e;
  }
  utils::ToLower((string *)local_1b8,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
  iVar7 = std::__cxx11::string::compare((char *)local_1b8);
  if (iVar7 == 0) {
    pbVar3 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (local_1b8 != (undefined1  [8])auStack_1a8) {
      operator_delete((void *)local_1b8);
    }
    if ((long)pbVar3 - (long)pbVar4 != 0x60) goto LAB_00156e79;
    utils::ToLower((string *)local_1b8,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 2);
    iVar7 = std::__cxx11::string::compare(local_1b8);
    if (local_1b8 != (undefined1  [8])auStack_1a8) {
      operator_delete((void *)local_1b8);
    }
    if (iVar7 == 0) {
      ActiveOperationalDataset::ActiveOperationalDataset((ActiveOperationalDataset *)local_1b8);
      ActiveDatasetFromJson((Error *)local_228,(ActiveOperationalDataset *)local_1b8,&local_1e8);
      __return_storage_ptr__->mCode = local_228._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_220);
      if (local_220._M_p != local_218 + 8) {
        operator_delete(local_220._M_p);
      }
      if (__return_storage_ptr__->mCode == kNone) {
LAB_00157338:
        bVar14 = true;
      }
      else {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump((string_t *)local_228,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_1f8,4,' ',false,strict);
        std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_228);
        if ((undefined1 *)CONCAT44(local_228._4_4_,local_228._0_4_) != local_218) {
          operator_delete((undefined1 *)CONCAT44(local_228._4_4_,local_228._0_4_));
        }
        ActiveDatasetFromJson((Error *)local_228,(ActiveOperationalDataset *)local_1b8,&local_1e8);
        __return_storage_ptr__->mCode = local_228._0_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_220);
        EVar2 = __return_storage_ptr__->mCode;
        if (local_220._M_p != local_218 + 8) {
          operator_delete(local_220._M_p);
        }
        if (EVar2 == kNone) goto LAB_00157338;
        bVar14 = false;
      }
      if (local_100 != (pointer)0x0) {
        operator_delete(local_100);
      }
      if (local_120 != (pointer)0x0) {
        operator_delete(local_120);
      }
      if (local_138 != (pointer)0x0) {
        operator_delete(local_138);
      }
      if (local_150 != (pointer)0x0) {
        operator_delete(local_150);
      }
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::~vector(&vStack_168);
      _Var12._M_p = local_190._M_p;
      if ((format_string_checker<char> *)local_190._M_p != (format_string_checker<char> *)local_180)
      goto LAB_00156ad0;
      goto LAB_00156ad5;
    }
    utils::ToLower((string *)local_1b8,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 2);
    iVar7 = std::__cxx11::string::compare(local_1b8);
    if (local_1b8 != (undefined1  [8])auStack_1a8) {
      operator_delete((void *)local_1b8);
    }
    if (iVar7 == 0) {
      PendingOperationalDataset::PendingOperationalDataset((PendingOperationalDataset *)local_1b8);
      PendingDatasetFromJson((Error *)local_228,(PendingOperationalDataset *)local_1b8,&local_1e8);
      __return_storage_ptr__->mCode = local_228._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_220);
      if (local_220._M_p != local_218 + 8) {
        operator_delete(local_220._M_p);
      }
      if (__return_storage_ptr__->mCode != kNone) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump((string_t *)local_228,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_1f8,4,' ',false,strict);
        std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_228);
        if ((undefined1 *)CONCAT44(local_228._4_4_,local_228._0_4_) != local_218) {
          operator_delete((undefined1 *)CONCAT44(local_228._4_4_,local_228._0_4_));
        }
        PendingDatasetFromJson((Error *)local_228,(PendingOperationalDataset *)local_1b8,&local_1e8)
        ;
        __return_storage_ptr__->mCode = local_228._0_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_220);
        EVar2 = __return_storage_ptr__->mCode;
        if (local_220._M_p != local_218 + 8) {
          operator_delete(local_220._M_p);
        }
        if (EVar2 != kNone) {
          ActiveOperationalDataset::~ActiveOperationalDataset((ActiveOperationalDataset *)local_1b8)
          ;
          goto LAB_0015656e;
        }
      }
      ActiveOperationalDataset::~ActiveOperationalDataset((ActiveOperationalDataset *)local_1b8);
      goto LAB_00156d2c;
    }
    fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    args_01.field_1.args_ = aVar13.args_;
    args_01.desc_ = (unsigned_long_long)local_d8;
    fmt::v10::vformat_abi_cxx11_
              ((string *)local_228,(v10 *)"import usupported",(string_view)ZEXT816(0x11),args_01);
    local_1b8._0_4_ = 2;
    local_1b0._M_p = (pointer)p_Var1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,CONCAT44(local_228._4_4_,local_228._0_4_),
               local_220._M_p + CONCAT44(local_228._4_4_,local_228._0_4_));
    __return_storage_ptr__->mCode = local_1b8._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_1b0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_p != p_Var1) {
      operator_delete(local_1b0._M_p);
    }
    puVar10 = (undefined8 *)local_218;
  }
  else {
    if (local_1b8 != (undefined1  [8])auStack_1a8) {
      operator_delete((void *)local_1b8);
    }
LAB_00156e79:
    local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffff00000000);
    local_1b0._M_p = "import usupported";
    auStack_1a8._0_8_ = 0x11;
    auStack_1a8._8_8_ = 0;
    local_190._M_p = (pointer)0x0;
    pcVar11 = "import usupported";
    auStack_1a8._16_8_ = (format_string_checker<char> *)local_1b8;
    do {
      pcVar9 = pcVar11 + 1;
      if (*pcVar11 == '}') {
        if ((pcVar9 == "") || (*pcVar9 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar9 = pcVar11 + 2;
      }
      else if (*pcVar11 == '{') {
        pcVar9 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar11,"",(format_string_checker<char> *)local_1b8);
      }
      pcVar11 = pcVar9;
    } while (pcVar9 != "");
    args_02.field_1.args_ = aVar13.args_;
    args_02.desc_ = (unsigned_long_long)local_1b8;
    fmt::v10::vformat_abi_cxx11_
              ((string *)local_d8,(v10 *)"import usupported",(string_view)ZEXT816(0x11),args_02);
    local_228._0_4_ = uint_type;
    local_220._M_p = local_218 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_220,CONCAT44(local_d8._4_4_,local_d8._0_4_),
               local_d0 + CONCAT44(local_d8._4_4_,local_d8._0_4_));
    __return_storage_ptr__->mCode = local_228._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_220);
    if (local_220._M_p != local_218 + 8) {
      operator_delete(local_220._M_p);
    }
    puVar10 = &local_c8;
  }
  if ((undefined8 *)puVar10[-2] != puVar10) {
    operator_delete((undefined8 *)puVar10[-2]);
  }
LAB_0015656e:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_1c8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_1c8 + 8),local_1c8[0]);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_1f8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_1f8 + 8),local_1f8[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::AppendImport(uint64_t aXpanId, Interpreter::Expression &aExpr)
{
    Error       error;
    std::string jsonStr;
    Json        jsonSrc;
    Json        json;

    SuccessOrExit(error = JsonFromFile(jsonStr, mImportFile));
    jsonSrc = Json::parse(jsonStr);
    if (aXpanId == 0) // must be single command
    {
        json = jsonSrc;
    }
    else if (jsonSrc.count(utils::Hex(aXpanId)) > 0)
    {
        json = jsonSrc[utils::Hex(aXpanId)];
    }
    jsonStr = json.dump(JSON_INDENT_DEFAULT);
    if (utils::ToLower(aExpr[0]) == "opdataset")
    {
        VerifyOrExit(utils::ToLower(aExpr[1]) == "set" && aExpr.size() == 3,
                     error = ERROR_INVALID_ARGS(SYNTAX_IMPORT_UNSUPPORTED));
        if (utils::ToLower(aExpr[2]) == "active")
        {
            ActiveOperationalDataset dataset;
            error = ActiveDatasetFromJson(dataset, jsonStr);
            if (error != ERROR_NONE)
            {
                jsonStr = jsonSrc.dump(JSON_INDENT_DEFAULT);
                SuccessOrExit(error = ActiveDatasetFromJson(dataset, jsonStr));
            }
            // TODO: try importing wrong format
        }
        else if (utils::ToLower(aExpr[2]) == "pending")
        {
            PendingOperationalDataset dataset;
            error = PendingDatasetFromJson(dataset, jsonStr);
            if (error != ERROR_NONE)
            {
                jsonStr = jsonSrc.dump(JSON_INDENT_DEFAULT);
                SuccessOrExit(error = PendingDatasetFromJson(dataset, jsonStr));
            }
            // TODO: try importing wrong format
        }
        else
        {
            ExitNow(error = ERROR_INVALID_ARGS(SYNTAX_IMPORT_UNSUPPORTED));
        }
    }
    else if (utils::ToLower(aExpr[0]) == "bbrdataset")
    {
        BbrDataset dataset;
        VerifyOrExit(aExpr.size() == 2 && utils::ToLower(aExpr[1]) == "set",
                     error = ERROR_INVALID_ARGS(SYNTAX_IMPORT_UNSUPPORTED));
        error = BbrDatasetFromJson(dataset, jsonStr);
        if (error != ERROR_NONE)
        {
            jsonStr = jsonSrc.dump(JSON_INDENT_DEFAULT);
            SuccessOrExit(error = BbrDatasetFromJson(dataset, jsonStr));
        }
        // TODO: try importing wrong format
    }
    else if (utils::ToLower(aExpr[0]) == "commdataset")
    {
        CommissionerDataset dataset;
        VerifyOrExit(aExpr.size() == 2 && utils::ToLower(aExpr[1]) == "set",
                     error = ERROR_INVALID_ARGS(SYNTAX_IMPORT_UNSUPPORTED));
        error = CommissionerDatasetFromJson(dataset, jsonStr);
        if (error != ERROR_NONE)
        {
            jsonStr = jsonSrc.dump(JSON_INDENT_DEFAULT);
            SuccessOrExit(error = CommissionerDatasetFromJson(dataset, jsonStr));
        }
        // TODO: try importing wrong format
    }
    else
    {
        ASSERT(false); // never to reach here
    }
    aExpr.push_back(jsonStr);
exit:
    return error;
}